

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O0

void EntityRelationTask::decode_tag(v_array<char> tag,char *type,int *id1,int *id2)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int *in_RDX;
  int *in_RSI;
  char *in_RDI;
  bool bVar4;
  size_t idx;
  string s2;
  string s1;
  ulong local_70;
  string local_58 [32];
  string local_38 [32];
  int *local_18;
  int *local_10;
  char *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  pcVar2 = v_array<char>::operator[]((v_array<char> *)&stack0x00000008,0);
  *local_8 = *pcVar2;
  local_70 = 2;
  while( true ) {
    sVar3 = v_array<char>::size((v_array<char> *)&stack0x00000008);
    bVar4 = false;
    if (local_70 < sVar3) {
      pcVar2 = v_array<char>::operator[]((v_array<char> *)&stack0x00000008,local_70);
      bVar4 = false;
      if (*pcVar2 != '_') {
        pcVar2 = v_array<char>::operator[]((v_array<char> *)&stack0x00000008,local_70);
        bVar4 = *pcVar2 != '\0';
      }
    }
    if (!bVar4) break;
    v_array<char>::operator[]((v_array<char> *)&stack0x00000008,local_70);
    std::__cxx11::string::push_back((char)local_38);
    local_70 = local_70 + 1;
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = atoi(pcVar2);
  *local_10 = iVar1;
  while( true ) {
    local_70 = local_70 + 1;
    sVar3 = v_array<char>::size((v_array<char> *)&stack0x00000008);
    bVar4 = false;
    if (local_70 < sVar3) {
      pcVar2 = v_array<char>::operator[]((v_array<char> *)&stack0x00000008,local_70);
      bVar4 = false;
      if (*pcVar2 != '_') {
        pcVar2 = v_array<char>::operator[]((v_array<char> *)&stack0x00000008,local_70);
        bVar4 = *pcVar2 != '\0';
      }
    }
    if (!bVar4) break;
    v_array<char>::operator[]((v_array<char> *)&stack0x00000008,local_70);
    std::__cxx11::string::push_back((char)local_58);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = atoi(pcVar2);
  *local_18 = iVar1;
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void decode_tag(v_array<char> tag, char& type, int& id1, int& id2)
{
  string s1;
  string s2;
  type = tag[0];
  size_t idx = 2;
  while (idx < tag.size() && tag[idx] != '_' && tag[idx] != '\0')
  {
    s1.push_back(tag[idx]);
    idx++;
  }
  id1 = atoi(s1.c_str());
  idx++;
  assert(type == 'R');
  while (idx < tag.size() && tag[idx] != '_' && tag[idx] != '\0')
  {
    s2.push_back(tag[idx]);
    idx++;
  }
  id2 = atoi(s2.c_str());
}